

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_threadio.c
# Opt level: O0

void INT_CMstart_read_thread(CMConnection_conflict conn)

{
  transport_entry p_Var1;
  pthread_t __th;
  _func_void_ptr_void_ptr *in_RDI;
  pthread_t thread;
  transport_entry in_stack_000000a0;
  CManager in_stack_000000a8;
  void *in_stack_fffffffffffffff0;
  
  p_Var1 = create_thread_read_transport(in_stack_000000a8,in_stack_000000a0);
  *(transport_entry *)(in_RDI + 8) = p_Var1;
  __th = thr_fork(in_RDI,in_stack_fffffffffffffff0);
  if (__th != 0) {
    pthread_detach(__th);
    return;
  }
  __assert_fail("thread",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_threadio.c"
                ,0x3e,"void INT_CMstart_read_thread(CMConnection)");
}

Assistant:

void
INT_CMstart_read_thread(CMConnection conn) {
    thr_thread_t thread;
    conn->trans = create_thread_read_transport(conn->cm, conn->trans);
    thread = thr_fork(read_thread_func, (void*)conn);
    assert(thread);
    thr_thread_detach(thread);
}